

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlCtxtParseDocument(xmlParserCtxtPtr ctxt,xmlParserInputPtr input)

{
  int iVar1;
  xmlParserInputPtr pxVar2;
  xmlDocPtr ret;
  xmlParserInputPtr input_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (input == (xmlParserInputPtr)0x0)) {
    xmlFatalErr(ctxt,XML_ERR_ARGUMENT,(char *)0x0);
    xmlFreeInputStream(input);
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    while (0 < ctxt->inputNr) {
      pxVar2 = xmlCtxtPopInput(ctxt);
      xmlFreeInputStream(pxVar2);
    }
    iVar1 = xmlCtxtPushInput(ctxt,input);
    if (iVar1 < 0) {
      xmlFreeInputStream(input);
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      xmlParseDocument(ctxt);
      ctxt_local = (xmlParserCtxtPtr)xmlCtxtGetDocument(ctxt);
      while (0 < ctxt->inputNr) {
        pxVar2 = xmlCtxtPopInput(ctxt);
        xmlFreeInputStream(pxVar2);
      }
    }
  }
  return (xmlDocPtr)ctxt_local;
}

Assistant:

xmlDocPtr
xmlCtxtParseDocument(xmlParserCtxtPtr ctxt, xmlParserInputPtr input)
{
    xmlDocPtr ret = NULL;

    if ((ctxt == NULL) || (input == NULL)) {
        xmlFatalErr(ctxt, XML_ERR_ARGUMENT, NULL);
        xmlFreeInputStream(input);
        return(NULL);
    }

    /* assert(ctxt->inputNr == 0); */
    while (ctxt->inputNr > 0)
        xmlFreeInputStream(xmlCtxtPopInput(ctxt));

    if (xmlCtxtPushInput(ctxt, input) < 0) {
        xmlFreeInputStream(input);
        return(NULL);
    }

    xmlParseDocument(ctxt);

    ret = xmlCtxtGetDocument(ctxt);

    /* assert(ctxt->inputNr == 1); */
    while (ctxt->inputNr > 0)
        xmlFreeInputStream(xmlCtxtPopInput(ctxt));

    return(ret);
}